

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

Amount __thiscall cfd::core::AbstractTransaction::GetValueOut(AbstractTransaction *this)

{
  CfdException *this_00;
  Amount AVar1;
  allocator local_45;
  int ret;
  uint64_t satoshi;
  undefined1 local_38 [32];
  
  satoshi = 0;
  ret = wally_tx_get_total_output_satoshi((wally_tx *)this->wally_tx_pointer_,&satoshi);
  if (ret == 0) {
    AVar1 = Amount::CreateBySatoshiAmount(satoshi);
    return AVar1;
  }
  local_38._0_8_ = "cfdcore_transaction_common.cpp";
  local_38._8_4_ = 0x262;
  local_38._16_8_ = "GetValueOut";
  logger::warn<int&>((CfdSourceLocation *)local_38,"wally_tx_get_total_output_satoshi NG[{}].",&ret)
  ;
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"total output calc error.",&local_45);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Amount AbstractTransaction::GetValueOut() const {
  uint64_t satoshi = 0;
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);

  int ret = wally_tx_get_total_output_satoshi(tx_pointer, &satoshi);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_total_output_satoshi NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "total output calc error.");
  }
  return Amount::CreateBySatoshiAmount(satoshi);
}